

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::AddGeneratorTarget(cmLocalGenerator *this,cmGeneratorTarget *gt)

{
  cmGeneratorTarget *local_18;
  
  local_18 = gt;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
            (&this->GeneratorTargets,&local_18);
  cmGlobalGenerator::IndexGeneratorTarget(this->GlobalGenerator,local_18);
  return;
}

Assistant:

void cmLocalGenerator::AddGeneratorTarget(cmGeneratorTarget* gt)
{
  this->GeneratorTargets.push_back(gt);
  this->GlobalGenerator->IndexGeneratorTarget(gt);
}